

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_BigNum.cpp
# Opt level: O3

bool __thiscall axl::cry::BigNum::create(BigNum *this)

{
  bool bVar1;
  BIGNUM *pBVar2;
  
  pBVar2 = (BIGNUM *)
           (this->super_Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>).m_h;
  if (pBVar2 != (BIGNUM *)0x0) {
    BN_free(pBVar2);
    (this->super_Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>).m_h =
         (bignum_st *)0x0;
  }
  pBVar2 = BN_new();
  (this->super_Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>).m_h =
       (bignum_st *)pBVar2;
  bVar1 = completeWithLastCryptoError<bool>(pBVar2 != (BIGNUM *)0x0,false);
  return bVar1;
}

Assistant:

bool
BigNum::create() {
	close();

	m_h = BN_new();
	return completeWithLastCryptoError(m_h != NULL);
}